

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void blend_tiled_generic_rgb64(int count,QT_FT_Span *spans,void *userData)

{
  uint uVar1;
  uint uVar2;
  BPP BVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  QRgba64 *pQVar7;
  undefined4 *puVar8;
  QThreadPool *pQVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  int i;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  long in_FS_OFFSET;
  bool bVar24;
  QSemaphore semaphore;
  Operator op;
  QRgba64 src_buffer [2048];
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&op,&DAT_0061d730,0xb0);
  getOperator(&op,(QSpanData *)userData,spans,count);
  if (op.func64 == (CompositionFunction64)0x0) {
    lcQtGuiDrawHelper();
    if (((byte)lcQtGuiDrawHelper::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      src_buffer[0].rgba._0_4_ = 2;
      src_buffer[0].rgba._4_4_ = 0;
      src_buffer[1].rgba._0_4_ = 0;
      src_buffer[1].rgba._4_4_ = 0;
      src_buffer[2].rgba._0_4_ = 0;
      src_buffer[2].rgba._4_4_ = 0;
      src_buffer[3].rgba = (quint64)lcQtGuiDrawHelper::category.name;
      QMessageLogger::debug
                ((char *)src_buffer,
                 "blend_tiled_generic_rgb64: unsupported 64-bit blend attempted, falling back to 32-bit"
                );
    }
    blend_tiled_generic(count,spans,userData);
  }
  else {
    uVar1 = *(uint *)((long)userData + 0xb0);
    lVar17 = (long)(int)uVar1;
    uVar2 = *(uint *)((long)userData + 0xb4);
    iVar12 = (int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                           0x3fe0000000000000) - *(double *)((long)userData + 0x70)) % (int)uVar1;
    iVar14 = (int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                           0x3fe0000000000000) - *(double *)((long)userData + 0x78)) % (int)uVar2;
    uVar18 = 0;
    if (0 < iVar12) {
      uVar18 = uVar1;
    }
    iVar12 = uVar18 - iVar12;
    uVar18 = 0;
    if (0 < iVar14) {
      uVar18 = uVar2;
    }
    iVar14 = uVar18 - iVar14;
    if (((lVar17 < 0x801) && (op.destFetch64 == destFetch64Undefined)) &&
       (BVar3 = qPixelLayouts[*(uint *)(*userData + 0x10)].bpp, (BVar3 & ~BPP1MSB) == BPP32)) {
      while( true ) {
        bVar24 = count == 0;
        count = count + -1;
        if (bVar24) break;
        iVar19 = spans->x;
        iVar4 = spans->y;
        uVar18 = spans->len;
        iVar13 = (iVar12 + iVar19) % (int)uVar1;
        iVar15 = (iVar14 + iVar4) % (int)uVar2;
        uVar22 = iVar13 >> 0x1f & uVar1;
        iVar15 = (iVar15 >> 0x1f & uVar2) + iVar15;
        uVar20 = uVar18;
        if ((int)uVar1 < (int)uVar18) {
          uVar20 = uVar1;
        }
        iVar23 = uVar22 + iVar13;
        if ((iVar23 != 0 && SCARRY4(uVar22,iVar13) == iVar23 < 0) && (0 < (int)uVar20)) {
          uVar22 = uVar1 - iVar23;
          if ((int)uVar20 <= (int)(uVar1 - iVar23)) {
            uVar22 = uVar20;
          }
          pQVar7 = (*op.srcFetch64)(src_buffer,&op,(QSpanData *)userData,iVar15,iVar23,uVar22);
          (*op.destStore64)(*userData,iVar19,iVar4,pQVar7,uVar22);
          iVar19 = iVar19 + uVar22;
          iVar23 = iVar23 + uVar22;
          uVar20 = uVar20 - uVar22;
          if ((int)uVar1 <= iVar23) {
            iVar23 = 0;
          }
        }
        if (0 < (int)uVar20) {
          pQVar7 = (*op.srcFetch64)(src_buffer,&op,(QSpanData *)userData,iVar15,iVar23,uVar20);
          (*op.destStore64)(*userData,iVar19,iVar4,pQVar7,uVar20);
          iVar19 = iVar19 + uVar20;
        }
        lVar16 = (long)iVar4 * *(long *)(*userData + 0x28) + *(long *)(*userData + 0x38);
        if (BVar3 == BPP32) {
          puVar8 = (undefined4 *)(lVar16 + (long)iVar19 * 4);
          for (lVar16 = lVar17; lVar16 < (int)uVar18; lVar16 = lVar16 + 1) {
            *puVar8 = puVar8[-lVar17];
            puVar8 = puVar8 + 1;
          }
        }
        else {
          puVar10 = (undefined8 *)(lVar16 + (long)iVar19 * 8);
          for (lVar16 = lVar17; lVar16 < (int)uVar18; lVar16 = lVar16 + 1) {
            *puVar10 = puVar10[-lVar17];
            puVar10 = puVar10 + 1;
          }
        }
        spans = spans + 1;
      }
    }
    else {
      src_buffer[3].rgba._4_4_ = uVar2;
      src_buffer[3].rgba._0_4_ = iVar14;
      src_buffer[2].rgba._0_4_ = iVar12;
      src_buffer[2].rgba._4_4_ = uVar1;
      src_buffer[4].rgba = (quint64)userData;
      src_buffer[0].rgba = (quint64)&op;
      src_buffer[1].rgba = (quint64)spans;
      pQVar9 = QGuiApplicationPrivate::qtGuiThreadPool();
      if (((0x5f < count) && (pQVar9 != (QThreadPool *)0x0)) &&
         (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
        QThread::currentThread();
        cVar6 = QThreadPool::contains((QThread *)pQVar9);
        if (cVar6 == '\0') {
          _semaphore = &DAT_aaaaaaaaaaaaaaaa;
          iVar14 = 0;
          QSemaphore::QSemaphore(&semaphore,0);
          uVar21 = (long)(count + 0x20) / 0x40 & 0xffffffff;
          while( true ) {
            iVar12 = (int)uVar21;
            uVar21 = (ulong)(iVar12 - 1);
            if (iVar12 == 0) break;
            iVar12 = (count - iVar14) / iVar12;
            puVar10 = (undefined8 *)operator_new(0x18);
            *(undefined1 *)(puVar10 + 1) = 1;
            *puVar10 = QFactoryLoader::keyMap;
            puVar11 = (undefined8 *)operator_new(0x20);
            *puVar11 = QRunnable::QGenericRunnable::
                       Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4839:5)>
                       ::impl;
            *(int *)(puVar11 + 1) = iVar14;
            *(int *)((long)puVar11 + 0xc) = iVar12;
            puVar11[2] = src_buffer;
            puVar11[3] = &semaphore;
            puVar10[2] = puVar11;
            QThreadPool::start((QRunnable *)pQVar9,(int)puVar10);
            iVar14 = iVar14 + iVar12;
          }
          QSemaphore::acquire((int)&semaphore);
          QSemaphore::~QSemaphore(&semaphore);
          goto LAB_005bde13;
        }
      }
      blend_tiled_generic_rgb64::anon_class_40_7_bfeee2df::operator()
                ((anon_class_40_7_bfeee2df *)src_buffer,0,count);
    }
  }
LAB_005bde13:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_tiled_generic_rgb64(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, spans, count);
    if (!op.func64) {
        qCDebug(lcQtGuiDrawHelper, "blend_tiled_generic_rgb64: unsupported 64-bit blend attempted, falling back to 32-bit");
        return blend_tiled_generic(count, spans, userData);
    }

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx) % image_width;
    int yoff = -qRound(-data->dy) % image_height;

    if (xoff < 0)
        xoff += image_width;
    if (yoff < 0)
        yoff += image_height;

    bool isBpp32 = qPixelLayouts[data->rasterBuffer->format].bpp == QPixelLayout::BPP32;
    bool isBpp64 = qPixelLayouts[data->rasterBuffer->format].bpp == QPixelLayout::BPP64;
    if (op.destFetch64 == destFetch64Undefined && image_width <= BufferSize && (isBpp32 || isBpp64)) {
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 src_buffer[BufferSize];
        // If destination isn't blended into the result, we can do the tiling directly on destination pixels.
        while (count--) {
            int x = spans->x;
            int y = spans->y;
            int length = spans->len;
            int sx = (xoff + spans->x) % image_width;
            int sy = (spans->y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            int sl = qMin(image_width, length);
            if (sx > 0 && sl > 0) {
                int l = qMin(image_width - sx, sl);
                const QRgba64 *src = op.srcFetch64(src_buffer, &op, data, sy, sx, l);
                op.destStore64(data->rasterBuffer, x, y, src, l);
                x += l;
                sx += l;
                sl -= l;
                if (sx >= image_width)
                    sx = 0;
            }
            if (sl > 0) {
                Q_ASSERT(sx == 0);
                const QRgba64 *src = op.srcFetch64(src_buffer, &op, data, sy, sx, sl);
                op.destStore64(data->rasterBuffer, x, y, src, sl);
                x += sl;
                sx += sl;
                sl -= sl;
                if (sx >= image_width)
                    sx = 0;
            }
            if (isBpp32) {
                uint *dest = reinterpret_cast<uint *>(data->rasterBuffer->scanLine(y)) + x - image_width;
                for (int i = image_width; i < length; ++i)
                    dest[i] = dest[i - image_width];
            } else {
                quint64 *dest = reinterpret_cast<quint64 *>(data->rasterBuffer->scanLine(y)) + x - image_width;
                for (int i = image_width; i < length; ++i)
                    dest[i] = dest[i - image_width];
            }
            ++spans;
        }
        return;
    }

    auto function = [=, &op](int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 src_buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = (xoff + spans[c].x) % image_width;
            int sy = (spans[c].y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            const int coverage = (spans[c].coverage * data->texture.const_alpha) >> 8;
            while (length) {
                int l = qMin(image_width - sx, length);
                if (BufferSize < l)
                    l = BufferSize;
                const QRgba64 *src = op.srcFetch64(src_buffer, &op, data, sy, sx, l);
                QRgba64 *dest = op.destFetch64(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.func64(dest, src, l, coverage);
                if (op.destStore64)
                    op.destStore64(data->rasterBuffer, x, spans[c].y, dest, l);
                x += l;
                sx += l;
                length -= l;
                if (sx >= image_width)
                    sx = 0;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}